

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.h
# Opt level: O0

bool __thiscall glslang::TSpirvType::operator==(TSpirvType *this,TSpirvType *rhs)

{
  bool bVar1;
  bool local_19;
  TSpirvType *rhs_local;
  TSpirvType *this_local;
  
  bVar1 = TSpirvInstruction::operator==(&this->spirvInst,&rhs->spirvInst);
  local_19 = false;
  if (bVar1) {
    local_19 = std::operator==(&(this->typeParams).
                                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                               ,&(rhs->typeParams).
                                 super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                              );
  }
  return local_19;
}

Assistant:

bool operator==(const TSpirvType& rhs) const
    {
        return spirvInst == rhs.spirvInst && typeParams == rhs.typeParams;
    }